

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O0

void __thiscall
icu_63::Normalizer2DataBuilder::writeCSourceFile(Normalizer2DataBuilder *this,char *filename)

{
  int32_t length;
  char *str;
  UErrorCode *pUVar1;
  char *pcVar2;
  char *path_00;
  FILE *__stream;
  UCPTrie *pTrie;
  char16_t *p;
  __off_t __length;
  StringPiece s;
  char local_168 [8];
  char line [100];
  FILE *f;
  char *name;
  char *extension;
  undefined4 local_d8;
  undefined1 local_d0 [8];
  CharString dataName;
  CharString path;
  char *basename;
  undefined1 local_38 [8];
  IcuToolErrorCode errorCode;
  LocalUCPTriePointer norm16Trie;
  char *filename_local;
  Normalizer2DataBuilder *this_local;
  
  processData((Normalizer2DataBuilder *)&errorCode.location);
  IcuToolErrorCode::IcuToolErrorCode((IcuToolErrorCode *)local_38,"gennorm2/writeCSourceFile()");
  str = findBasename(filename);
  path.len = (int32_t)str;
  pUVar1 = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)local_38);
  CharString::CharString((CharString *)&dataName.len,filename,path.len - (int)filename,pUVar1);
  StringPiece::StringPiece((StringPiece *)&extension,str);
  pUVar1 = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)local_38);
  s._12_4_ = 0;
  s.ptr_ = extension;
  s.length_ = local_d8;
  CharString::CharString((CharString *)local_d0,s,pUVar1);
  pcVar2 = strrchr(str,0x2e);
  if (pcVar2 != (char *)0x0) {
    name._0_4_ = (int)pcVar2;
    CharString::truncate
              ((CharString *)local_d0,(char *)(ulong)(uint)((int)name - path.len),__length);
  }
  pcVar2 = CharString::data((CharString *)local_d0);
  ErrorCode::assertSuccess((ErrorCode *)local_38);
  path_00 = CharString::data((CharString *)&dataName.len);
  __stream = (FILE *)usrc_create(path_00,str,0x7e0,"icu/source/tools/gennorm2/n2builder.cpp");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"gennorm2/writeCSourceFile() error: unable to create the output file %s\n",
            filename);
    exit(4);
  }
  fputs("#ifdef INCLUDED_FROM_NORMALIZER2_CPP\n\n",__stream);
  sprintf(local_168,"static const UVersionInfo %s_formatVersion={",pcVar2);
  usrc_writeArray((FILE *)__stream,local_168,::dataInfo.formatVersion,8,4,"};\n");
  sprintf(local_168,"static const UVersionInfo %s_dataVersion={",pcVar2);
  usrc_writeArray((FILE *)__stream,local_168,::dataInfo.dataVersion,8,4,"};\n\n");
  sprintf(local_168,"static const int32_t %s_indexes[Normalizer2Impl::IX_COUNT]={\n",pcVar2);
  usrc_writeArray((FILE *)__stream,local_168,this->indexes,0x20,0x14,"\n};\n\n");
  pTrie = LocalPointerBase<UCPTrie>::getAlias((LocalPointerBase<UCPTrie> *)&errorCode.location);
  usrc_writeUCPTrie((FILE *)__stream,pcVar2,pTrie);
  sprintf(local_168,"static const uint16_t %s_extraData[%%ld]={\n",pcVar2);
  p = UnicodeString::getBuffer(&this->extraData);
  length = UnicodeString::length(&this->extraData);
  usrc_writeArray((FILE *)__stream,local_168,p,0x10,length,"\n};\n\n");
  sprintf(local_168,"static const uint8_t %s_smallFCD[%%ld]={\n",pcVar2);
  usrc_writeArray((FILE *)__stream,local_168,this->smallFCD,8,0x100,"\n};\n\n");
  fputs("#endif  // INCLUDED_FROM_NORMALIZER2_CPP\n",__stream);
  fclose(__stream);
  CharString::~CharString((CharString *)local_d0);
  CharString::~CharString((CharString *)&dataName.len);
  IcuToolErrorCode::~IcuToolErrorCode((IcuToolErrorCode *)local_38);
  LocalUCPTriePointer::~LocalUCPTriePointer((LocalUCPTriePointer *)&errorCode.location);
  return;
}

Assistant:

void
Normalizer2DataBuilder::writeCSourceFile(const char *filename) {
    LocalUCPTriePointer norm16Trie = processData();

    IcuToolErrorCode errorCode("gennorm2/writeCSourceFile()");
    const char *basename=findBasename(filename);
    CharString path(filename, (int32_t)(basename-filename), errorCode);
    CharString dataName(basename, errorCode);
    const char *extension=strrchr(basename, '.');
    if(extension!=NULL) {
        dataName.truncate((int32_t)(extension-basename));
    }
    const char *name=dataName.data();
    errorCode.assertSuccess();

    FILE *f=usrc_create(path.data(), basename, 2016, "icu/source/tools/gennorm2/n2builder.cpp");
    if(f==NULL) {
        fprintf(stderr, "gennorm2/writeCSourceFile() error: unable to create the output file %s\n",
                filename);
        exit(U_FILE_ACCESS_ERROR);
    }
    fputs("#ifdef INCLUDED_FROM_NORMALIZER2_CPP\n\n", f);

    char line[100];
    sprintf(line, "static const UVersionInfo %s_formatVersion={", name);
    usrc_writeArray(f, line, dataInfo.formatVersion, 8, 4, "};\n");
    sprintf(line, "static const UVersionInfo %s_dataVersion={", name);
    usrc_writeArray(f, line, dataInfo.dataVersion, 8, 4, "};\n\n");
    sprintf(line, "static const int32_t %s_indexes[Normalizer2Impl::IX_COUNT]={\n", name);
    usrc_writeArray(f, line, indexes, 32, Normalizer2Impl::IX_COUNT, "\n};\n\n");

    usrc_writeUCPTrie(f, name, norm16Trie.getAlias());

    sprintf(line, "static const uint16_t %s_extraData[%%ld]={\n", name);
    usrc_writeArray(f, line, extraData.getBuffer(), 16, extraData.length(), "\n};\n\n");
    sprintf(line, "static const uint8_t %s_smallFCD[%%ld]={\n", name);
    usrc_writeArray(f, line, smallFCD, 8, sizeof(smallFCD), "\n};\n\n");

    fputs("#endif  // INCLUDED_FROM_NORMALIZER2_CPP\n", f);
    fclose(f);
}